

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::stringifyBinaryExpr<unsigned_long,unsigned_long>
          (String *__return_storage_ptr__,detail *this,unsigned_long *lhs,char *op,
          unsigned_long *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  unsigned_long *local_28;
  unsigned_long *rhs_local;
  char *op_local;
  unsigned_long *lhs_local;
  
  local_28 = (unsigned_long *)op;
  rhs_local = lhs;
  op_local = (char *)this;
  lhs_local = (unsigned_long *)__return_storage_ptr__;
  doctest::toString(&local_58,*(unsigned_long *)this);
  String::String(&local_70,(char *)rhs_local);
  String::operator+(&local_40,&local_58,&local_70);
  doctest::toString(&local_98,*local_28);
  String::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }